

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_widget_space(nk_rect *bounds,nk_context *ctx,nk_window *win,int modify)

{
  float *pfVar1;
  nk_panel *pnVar2;
  nk_vec2 nVar3;
  float fVar4;
  nk_vec2 nVar5;
  float local_78;
  float local_74;
  float ratio;
  float local_54;
  float panel_space;
  float item_spacing;
  float item_width;
  float item_offset;
  nk_vec2 padding;
  nk_vec2 spacing;
  nk_style *style;
  nk_panel *layout;
  int modify_local;
  nk_window *win_local;
  nk_context *ctx_local;
  nk_rect *bounds_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x465c,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x465d,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x465e,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  if (ctx != (nk_context *)0x0) {
    if (ctx->current == (nk_window *)0x0) {
      return;
    }
    if (ctx->current->layout == (nk_panel *)0x0) {
      return;
    }
    pnVar2 = ctx->current->layout;
    if (bounds == (nk_rect *)0x0) {
      __assert_fail("bounds",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x4665,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    nVar3 = (ctx->style).window.spacing;
    nVar5 = nk_panel_get_padding(&ctx->style,pnVar2->type);
    local_74 = nk_layout_row_calculate_usable_space
                         (&ctx->style,pnVar2->type,(pnVar2->bounds).w,(pnVar2->row).columns);
    padding.x = nVar3.x;
    switch((pnVar2->row).type) {
    case NK_LAYOUT_DYNAMIC_FIXED:
      if (local_74 <= 1.0) {
        local_74 = 1.0;
      }
      panel_space = local_74 / (float)(pnVar2->row).columns;
      item_spacing = (float)(pnVar2->row).index * panel_space;
      local_54 = (float)(pnVar2->row).index * padding.x;
      break;
    case NK_LAYOUT_DYNAMIC_ROW:
      panel_space = (pnVar2->row).item_width * local_74;
      item_spacing = (pnVar2->row).item_offset;
      local_54 = 0.0;
      if (modify != 0) {
        (pnVar2->row).item_offset = panel_space + padding.x + (pnVar2->row).item_offset;
        (pnVar2->row).filled = (pnVar2->row).item_width + (pnVar2->row).filled;
        (pnVar2->row).index = 0;
      }
      break;
    case NK_LAYOUT_DYNAMIC_FREE:
      bounds->x = (pnVar2->bounds).w * (pnVar2->row).item.x + pnVar2->at_x;
      bounds->x = bounds->x - (float)*pnVar2->offset_x;
      bounds->y = (pnVar2->row).height * (pnVar2->row).item.y + pnVar2->at_y;
      bounds->y = bounds->y - (float)*pnVar2->offset_y;
      bounds->w = (pnVar2->bounds).w * (pnVar2->row).item.w;
      bounds->h = (pnVar2->row).height * (pnVar2->row).item.h;
      return;
    case NK_LAYOUT_DYNAMIC:
      if ((pnVar2->row).ratio == (float *)0x0) {
        __assert_fail("layout->row.ratio",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x468d,
                      "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                     );
      }
      pfVar1 = (pnVar2->row).ratio + (pnVar2->row).index;
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        local_78 = (pnVar2->row).ratio[(pnVar2->row).index];
      }
      else {
        local_78 = (pnVar2->row).item_width;
      }
      local_54 = (float)(pnVar2->row).index * padding.x;
      panel_space = local_78 * local_74;
      item_spacing = (pnVar2->row).item_offset;
      if (modify != 0) {
        (pnVar2->row).item_offset = panel_space + (pnVar2->row).item_offset;
        (pnVar2->row).filled = local_78 + (pnVar2->row).filled;
      }
      break;
    case NK_LAYOUT_STATIC_FIXED:
      panel_space = (pnVar2->row).item_width;
      item_spacing = (float)(pnVar2->row).index * panel_space;
      local_54 = (float)(pnVar2->row).index * padding.x;
      break;
    case NK_LAYOUT_STATIC_ROW:
      panel_space = (pnVar2->row).item_width;
      item_spacing = (pnVar2->row).item_offset;
      local_54 = (float)(pnVar2->row).index * padding.x;
      if (modify != 0) {
        (pnVar2->row).item_offset = panel_space + (pnVar2->row).item_offset;
      }
      break;
    case NK_LAYOUT_STATIC_FREE:
      bounds->x = pnVar2->at_x + (pnVar2->row).item.x;
      bounds->w = (pnVar2->row).item.w;
      fVar4 = bounds->x + bounds->w;
      if ((pnVar2->max_x <= fVar4 && fVar4 != pnVar2->max_x) && (modify != 0)) {
        pnVar2->max_x = bounds->x + bounds->w;
      }
      bounds->x = bounds->x - (float)*pnVar2->offset_x;
      bounds->y = pnVar2->at_y + (pnVar2->row).item.y;
      bounds->y = bounds->y - (float)*pnVar2->offset_y;
      bounds->h = (pnVar2->row).item.h;
      return;
    case NK_LAYOUT_STATIC:
      local_54 = (float)(pnVar2->row).index * padding.x;
      panel_space = (pnVar2->row).ratio[(pnVar2->row).index];
      item_spacing = (pnVar2->row).item_offset;
      if (modify != 0) {
        (pnVar2->row).item_offset = panel_space + (pnVar2->row).item_offset;
      }
      break;
    case NK_LAYOUT_TEMPLATE:
      if ((pnVar2->row).columns <= (pnVar2->row).index) {
        __assert_fail("layout->row.index < layout->row.columns",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x46bc,
                      "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                     );
      }
      if (0xf < (pnVar2->row).index) {
        __assert_fail("layout->row.index < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x46bd,
                      "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                     );
      }
      panel_space = (pnVar2->row).templates[(pnVar2->row).index];
      item_spacing = (pnVar2->row).item_offset;
      local_54 = (float)(pnVar2->row).index * padding.x;
      if (modify != 0) {
        (pnVar2->row).item_offset = panel_space + (pnVar2->row).item_offset;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x46c3,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    bounds->w = panel_space;
    padding.y = nVar3.y;
    bounds->h = (pnVar2->row).height - padding.y;
    bounds->y = pnVar2->at_y - (float)*pnVar2->offset_y;
    item_width = nVar5.x;
    bounds->x = pnVar2->at_x + item_spacing + local_54 + item_width;
    fVar4 = bounds->x + bounds->w;
    if ((pnVar2->max_x <= fVar4 && fVar4 != pnVar2->max_x) && (modify != 0)) {
      pnVar2->max_x = bounds->x + bounds->w;
    }
    bounds->x = bounds->x - (float)*pnVar2->offset_x;
    return;
  }
  return;
}

Assistant:

NK_LIB void
nk_layout_widget_space(struct nk_rect *bounds, const struct nk_context *ctx,
    struct nk_window *win, int modify)
{
    struct nk_panel *layout;
    const struct nk_style *style;

    struct nk_vec2 spacing;
    struct nk_vec2 padding;

    float item_offset = 0;
    float item_width = 0;
    float item_spacing = 0;
    float panel_space = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    NK_ASSERT(bounds);

    spacing = style->window.spacing;
    padding = nk_panel_get_padding(style, layout->type);
    panel_space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
                                            layout->bounds.w, layout->row.columns);

    /* calculate the width of one item inside the current layout space */
    switch (layout->row.type) {
    case NK_LAYOUT_DYNAMIC_FIXED: {
        /* scaling fixed size widgets item width */
        item_width = NK_MAX(1.0f,panel_space) / (float)layout->row.columns;
        item_offset = (float)layout->row.index * item_width;
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_DYNAMIC_ROW: {
        /* scaling single ratio widget width */
        item_width = layout->row.item_width * panel_space;
        item_offset = layout->row.item_offset;
        item_spacing = 0;

        if (modify) {
            layout->row.item_offset += item_width + spacing.x;
            layout->row.filled += layout->row.item_width;
            layout->row.index = 0;
        }
    } break;
    case NK_LAYOUT_DYNAMIC_FREE: {
        /* panel width depended free widget placing */
        bounds->x = layout->at_x + (layout->bounds.w * layout->row.item.x);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + (layout->row.height * layout->row.item.y);
        bounds->y -= (float)*layout->offset_y;
        bounds->w = layout->bounds.w  * layout->row.item.w;
        bounds->h = layout->row.height * layout->row.item.h;
        return;
    }
    case NK_LAYOUT_DYNAMIC: {
        /* scaling arrays of panel width ratios for every widget */
        float ratio;
        NK_ASSERT(layout->row.ratio);
        ratio = (layout->row.ratio[layout->row.index] < 0) ?
            layout->row.item_width : layout->row.ratio[layout->row.index];

        item_spacing = (float)layout->row.index * spacing.x;
        item_width = (ratio * panel_space);
        item_offset = layout->row.item_offset;

        if (modify) {
            layout->row.item_offset += item_width;
            layout->row.filled += ratio;
        }
    } break;
    case NK_LAYOUT_STATIC_FIXED: {
        /* non-scaling fixed widgets item width */
        item_width = layout->row.item_width;
        item_offset = (float)layout->row.index * item_width;
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_STATIC_ROW: {
        /* scaling single ratio widget width */
        item_width = layout->row.item_width;
        item_offset = layout->row.item_offset;
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_STATIC_FREE: {
        /* free widget placing */
        bounds->x = layout->at_x + layout->row.item.x;
        bounds->w = layout->row.item.w;
        if (((bounds->x + bounds->w) > layout->max_x) && modify)
            layout->max_x = (bounds->x + bounds->w);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + layout->row.item.y;
        bounds->y -= (float)*layout->offset_y;
        bounds->h = layout->row.item.h;
        return;
    }
    case NK_LAYOUT_STATIC: {
        /* non-scaling array of panel pixel width for every widget */
        item_spacing = (float)layout->row.index * spacing.x;
        item_width = layout->row.ratio[layout->row.index];
        item_offset = layout->row.item_offset;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_TEMPLATE: {
        /* stretchy row layout with combined dynamic/static widget width*/
        NK_ASSERT(layout->row.index < layout->row.columns);
        NK_ASSERT(layout->row.index < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
        item_width = layout->row.templates[layout->row.index];
        item_offset = layout->row.item_offset;
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += item_width;
    } break;
    default: NK_ASSERT(0); break;
    };

    /* set the bounds of the newly allocated widget */
    bounds->w = item_width;
    bounds->h = layout->row.height - spacing.y;
    bounds->y = layout->at_y - (float)*layout->offset_y;
    bounds->x = layout->at_x + item_offset + item_spacing + padding.x;
    if (((bounds->x + bounds->w) > layout->max_x) && modify)
        layout->max_x = bounds->x + bounds->w;
    bounds->x -= (float)*layout->offset_x;
}